

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall
StringInstance::op_isLexicographicallyGreaterThanOrEqualTo
          (StringInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  size_type sVar2;
  undefined8 *puVar3;
  char *pcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  enable_shared_from_this<Instance> *in_stack_ffffffffffffff68;
  shared_ptr<Instance> *in_stack_ffffffffffffff70;
  allocator *paVar5;
  shared_ptr<Instance> *lhs;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  string *str;
  allocator local_5d [29];
  shared_ptr<Instance> local_40 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  str = in_RDI;
  local_18 = in_RDX;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar2 != 1) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  bVar1 = Grammar::is_string_value(str);
  if (!bVar1) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "RuntimeError: invalid argument.";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  std::enable_shared_from_this<Instance>::shared_from_this(in_stack_ffffffffffffff68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  std::make_shared<StringInstance,std::__cxx11::string_const&>(in_RSI);
  lhs = local_40;
  std::shared_ptr<Instance>::shared_ptr<StringInstance,void>
            (in_stack_ffffffffffffff70,(shared_ptr<StringInstance> *)in_stack_ffffffffffffff68);
  bVar1 = InstanceIsGreaterThanOrEqualToComparator::operator()
                    ((InstanceIsGreaterThanOrEqualToComparator *)
                     CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),lhs,
                     in_stack_ffffffffffffff70);
  pcVar4 = "false";
  if (bVar1) {
    pcVar4 = "true";
  }
  paVar5 = local_5d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)str,pcVar4,paVar5);
  std::allocator<char>::~allocator((allocator<char> *)local_5d);
  std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1bbdbd);
  std::shared_ptr<StringInstance>::~shared_ptr((shared_ptr<StringInstance> *)0x1bbdc7);
  std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1bbdd1);
  return in_RDI;
}

Assistant:

std::string StringInstance::op_isLexicographicallyGreaterThanOrEqualTo(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    if (!Grammar::is_string_value(arguments[0]))
        throw EXC_INVALID_ARGUMENT;
    return InstanceIsGreaterThanOrEqualToComparator()(shared_from_this(),
                                                      std::make_shared<StringInstance>(arguments[0])) ?
           "true" : "false";
}